

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::VerifyDynamicBufferOffset<Diligent::BufferVkImpl,Diligent::BufferViewVkImpl>
               (PipelineResourceDesc *ResDesc,IDeviceObject *pObject,Uint64 BufferBaseOffset,
               Uint64 BufferRangeSize,Uint64 BufferDynamicOffset)

{
  char cVar1;
  PIPELINE_RESOURCE_FLAGS PVar2;
  Char *pCVar3;
  BufferViewVkImpl *this;
  BufferViewDesc *Args_1;
  BufferDesc *Args_8;
  RenderDeviceVkImpl *this_00;
  GraphicsAdapterInfo *pGVar4;
  char (*in_stack_fffffffffffffe08) [3];
  char (*in_stack_fffffffffffffe38) [2];
  Uint32 local_1ac;
  BufferVkImpl *local_180;
  undefined1 local_168 [8];
  string msg_6;
  string msg_5;
  Uint32 OffsetAlignment;
  BufferProperties *BufferProps;
  long local_110;
  undefined1 local_108 [8];
  string msg_4;
  BufferDesc *BuffDesc;
  string msg_3;
  string msg_2;
  string msg_1;
  BufferViewDesc *ViewDesc;
  BufferViewVkImpl *pBuffView;
  BufferVkImpl *pBuffer;
  undefined1 local_58 [8];
  string msg;
  Uint64 UStack_30;
  bool BindingOK;
  Uint64 BufferDynamicOffset_local;
  Uint64 BufferRangeSize_local;
  Uint64 BufferBaseOffset_local;
  IDeviceObject *pObject_local;
  PipelineResourceDesc *ResDesc_local;
  
  msg.field_2._M_local_buf[0xf] = '\x01';
  UStack_30 = BufferDynamicOffset;
  BufferDynamicOffset_local = BufferRangeSize;
  BufferRangeSize_local = BufferBaseOffset;
  BufferBaseOffset_local = (Uint64)pObject;
  pObject_local = (IDeviceObject *)ResDesc;
  PVar2 = operator&(ResDesc->Flags,PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS);
  if (PVar2 != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[51],char_const*,char[81]>
              ((string *)local_58,(Diligent *)"Error setting dynamic buffer offset for variable \'",
               (char (*) [51])pObject_local,
               (char **)
               "\': the variable was created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.",
               (char (*) [81])BufferDynamicOffset);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x221);
    std::__cxx11::string::~string((string *)local_58);
    msg.field_2._M_local_buf[0xf] = '\0';
  }
  pBuffView = (BufferViewVkImpl *)0x0;
  cVar1 = *(char *)&pObject_local[2].super_IObject._vptr_IObject;
  if (cVar1 == '\x01') {
    pBuffView = (BufferViewVkImpl *)
                ClassPtrCast<Diligent::BufferVkImpl_const,Diligent::IDeviceObject_const>
                          ((IDeviceObject *)BufferBaseOffset_local);
  }
  else if ((cVar1 == '\x03') || (cVar1 == '\x05')) {
    this = ClassPtrCast<Diligent::BufferViewVkImpl_const,Diligent::IDeviceObject_const>
                     ((IDeviceObject *)BufferBaseOffset_local);
    if (this != (BufferViewVkImpl *)0x0) {
      if (BufferBaseOffset_local == 0) {
        local_180 = (BufferVkImpl *)0x0;
      }
      else {
        local_180 = BufferViewBase<Diligent::EngineVkImplTraits>::
                    GetBuffer<Diligent::BufferVkImpl_const>
                              (&this->super_BufferViewBase<Diligent::EngineVkImplTraits>);
      }
      pBuffView = (BufferViewVkImpl *)local_180;
      Args_1 = DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
               ::GetDesc((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                          *)this);
      if ((BufferRangeSize_local != 0) && (BufferRangeSize_local != Args_1->ByteOffset)) {
        FormatString<char[26],char[65]>
                  ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BufferBaseOffset == 0 || BufferBaseOffset == ViewDesc.ByteOffset"
                   ,(char (*) [65])Args_1);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"VerifyDynamicBufferOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x233);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      if ((BufferDynamicOffset_local != 0) && (BufferDynamicOffset_local != Args_1->ByteWidth)) {
        FormatString<char[26],char[62]>
                  ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BufferRangeSize == 0 || BufferRangeSize == ViewDesc.ByteWidth",
                   (char (*) [62])Args_1);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"VerifyDynamicBufferOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x234);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      BufferRangeSize_local = Args_1->ByteOffset;
      BufferDynamicOffset_local = Args_1->ByteWidth;
    }
  }
  else {
    FormatString<char[51],char_const*,char[67]>
              ((string *)&BuffDesc,(Diligent *)"Error setting dynamic buffer offset for variable \'"
               ,(char (*) [51])pObject_local,
               (char **)"\': the offset may only be set for constant and structured buffers.",
               (char (*) [67])BufferDynamicOffset);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x23b);
    std::__cxx11::string::~string((string *)&BuffDesc);
  }
  if (pBuffView != (BufferViewVkImpl *)0x0) {
    Args_8 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)pBuffView);
    msg_4.field_2._8_8_ = Args_8;
    if (Args_8->Size < BufferRangeSize_local + BufferDynamicOffset_local + UStack_30) {
      local_110 = BufferRangeSize_local + UStack_30;
      BufferProps = (BufferProperties *)
                    (BufferRangeSize_local + BufferDynamicOffset_local + UStack_30);
      in_stack_fffffffffffffe08 = (char (*) [3])&BufferProps;
      FormatString<char[16],unsigned_long,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
                ((string *)local_108,(Diligent *)"Dynamic offset ",
                 (char (*) [16])&stack0xffffffffffffffd0,(unsigned_long *)0xc285be,
                 (char (*) [26])pObject_local,(char **)"\' defines buffer range [",
                 (char (*) [25])&local_110,(unsigned_long *)0xd26306,in_stack_fffffffffffffe08,
                 (unsigned_long *)") that is past the bounds of buffer \'",(char (*) [38])Args_8,
                 (char **)"\' of size ",(char (*) [11])&Args_8->Size,(unsigned_long *)0xcca6b6,
                 in_stack_fffffffffffffe38);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      Args_8 = (BufferDesc *)0x246;
      DebugAssertionFailed
                (pCVar3,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x246);
      std::__cxx11::string::~string((string *)local_108);
      msg.field_2._M_local_buf[0xf] = '\0';
    }
    this_00 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                           *)pBuffView);
    pGVar4 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                       ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
    if (*(char *)&pObject_local[2].super_IObject._vptr_IObject == '\x01') {
      local_1ac = (pGVar4->Buffer).ConstantBufferOffsetAlignment;
    }
    else {
      local_1ac = (pGVar4->Buffer).StructuredBufferOffsetAlignment;
    }
    msg_5.field_2._12_4_ = local_1ac;
    if (local_1ac == 0) {
      FormatString<char[26],char[21]>
                ((string *)((long)&msg_6.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])0xcc0fe6,(char (*) [21])Args_8);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x24f);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    if (UStack_30 % (ulong)(uint)msg_5.field_2._12_4_ != 0) {
      FormatString<char[17],unsigned_long,char[27],char_const*,char[51],unsigned_int,char[3]>
                ((string *)local_168,(Diligent *)"Dynamic offset (",
                 (char (*) [17])&stack0xffffffffffffffd0,
                 (unsigned_long *)") specified for variable \'",(char (*) [27])pObject_local,
                 (char **)"\' is not a multiple of required offset alignment (",
                 (char (*) [51])((long)&msg_5.field_2 + 0xc),(uint *)0xccce78,
                 in_stack_fffffffffffffe08);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x254);
      std::__cxx11::string::~string((string *)local_168);
      msg.field_2._M_local_buf[0xf] = '\0';
    }
  }
  return (bool)(msg.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool VerifyDynamicBufferOffset(const PipelineResourceDesc& ResDesc,
                               const IDeviceObject*        pObject,
                               Uint64                      BufferBaseOffset,
                               Uint64                      BufferRangeSize,
                               Uint64                      BufferDynamicOffset)
{
    bool BindingOK = true;

    if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Error setting dynamic buffer offset for variable '", ResDesc.Name, "': the variable was created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.");
        BindingOK = false;
    }

    const BufferImplType* pBuffer = nullptr;
    switch (ResDesc.ResourceType)
    {
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
            pBuffer = ClassPtrCast<const BufferImplType>(pObject);
            break;

        case SHADER_RESOURCE_TYPE_BUFFER_SRV:
        case SHADER_RESOURCE_TYPE_BUFFER_UAV:
            if (const BufferViewImplType* pBuffView = ClassPtrCast<const BufferViewImplType>(pObject))
            {
                pBuffer = pObject != nullptr ? pBuffView->template GetBuffer<const BufferImplType>() : nullptr;

                const BufferViewDesc& ViewDesc = pBuffView->GetDesc();
                VERIFY_EXPR(BufferBaseOffset == 0 || BufferBaseOffset == ViewDesc.ByteOffset);
                VERIFY_EXPR(BufferRangeSize == 0 || BufferRangeSize == ViewDesc.ByteWidth);
                BufferBaseOffset = ViewDesc.ByteOffset;
                BufferRangeSize  = ViewDesc.ByteWidth;
            }
            break;

        default:
            RESOURCE_VALIDATION_FAILURE("Error setting dynamic buffer offset for variable '", ResDesc.Name, "': the offset may only be set for constant and structured buffers.");
    }

    if (pBuffer != nullptr)
    {
        const BufferDesc& BuffDesc = pBuffer->GetDesc();
        if (BufferBaseOffset + BufferRangeSize + BufferDynamicOffset > BuffDesc.Size)
        {
            RESOURCE_VALIDATION_FAILURE("Dynamic offset ", BufferDynamicOffset, " specified for variable '", ResDesc.Name,
                                        "' defines buffer range [", BufferBaseOffset + BufferDynamicOffset, ", ",
                                        BufferBaseOffset + BufferRangeSize + BufferDynamicOffset,
                                        ") that is past the bounds of buffer '", BuffDesc.Name, "' of size ", BuffDesc.Size, ".");
            BindingOK = false;
        }

        const BufferProperties& BufferProps = pBuffer->GetDevice()->GetAdapterInfo().Buffer;

        const Uint32 OffsetAlignment = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) ?
            BufferProps.ConstantBufferOffsetAlignment :
            BufferProps.StructuredBufferOffsetAlignment;
        VERIFY_EXPR(OffsetAlignment != 0);

        if ((BufferDynamicOffset % OffsetAlignment) != 0)
        {
            RESOURCE_VALIDATION_FAILURE("Dynamic offset (", BufferDynamicOffset, ") specified for variable '", ResDesc.Name,
                                        "' is not a multiple of required offset alignment (", OffsetAlignment, ").");
            BindingOK = false;
        }
    }

    return BindingOK;
}